

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void __thiscall kratos::VarUnusedVisitor::visit(VarUnusedVisitor *this,Generator *generator)

{
  char cVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  undefined1 local_b0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  vars;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vars_to_remove;
  long local_48;
  long local_40 [2];
  
  if (((generator->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (generator->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && ((generator->is_external_ & 1U) == 0)) {
    vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&vars_to_remove;
    vars_to_remove._M_t._M_impl._0_4_ = 0;
    vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                *)local_b0,&(generator->vars_)._M_t);
    if (vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Rb_tree_node_base *)&vars)
    {
      p_Var5 = vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        if ((((int)(*(long **)(p_Var5 + 2))[0x2d] == 0) &&
            (cVar1 = (**(code **)(**(long **)(p_Var5 + 2) + 0xe8))(), cVar1 == '\0')) &&
           (lVar3 = (**(code **)(**(long **)(p_Var5 + 2) + 0x70))(), *(long *)(lVar3 + 0x18) == 0))
        {
          lVar3 = (**(code **)(**(long **)(p_Var5 + 2) + 0x80))();
          if ((*(long *)(lVar3 + 0x18) == 0) &&
             (cVar1 = (**(code **)(**(long **)(p_Var5 + 2) + 0xe8))(), cVar1 == '\0')) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_emplace_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var5 + 1));
          }
          else {
            iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->error_mutex_);
            if (iVar2 != 0) {
              std::__throw_system_error(iVar2);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Variable: ",10);
            (**(code **)(**(long **)(p_Var5 + 2) + 0xf8))
                      (&vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,
                                (char *)vars_to_remove._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count,local_48);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," has no sink",0xc);
            std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            if ((long *)vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count != local_40)
            {
              operator_delete((void *)vars_to_remove._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count,local_40[0] + 1);
            }
            print_ast_node(*(IRNode **)(p_Var5 + 2));
            pthread_mutex_unlock((pthread_mutex_t *)&this->error_mutex_);
          }
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != (_Rb_tree_node_base *)&vars);
    }
    for (p_Var6 = vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 != (_Rb_tree_node_base *)&vars_to_remove;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      Generator::remove_var(generator,(string *)(p_Var6 + 1));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                 *)local_b0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (generator->external()) return;
        std::set<std::string> vars_to_remove;
        auto vars = generator->vars();
        for (auto const& [var_name, var] : vars) {
            if (var->type() != VarType::Base || var->is_interface()) continue;
            if (var->sinks().empty()) {
                if (var->sources().empty() && !var->is_interface()) {
                    vars_to_remove.emplace(var_name);
                } else {
                    // print out warnings
                    error_mutex_.lock();
                    std::cerr << "Variable: " << var->to_string() << " has no sink" << std::endl;
                    print_ast_node(var.get());
                    error_mutex_.unlock();
                }
            }
        }

        // remove unused vars
        for (auto const& var_name : vars_to_remove) {
            generator->remove_var(var_name);
        }
    }